

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::TreeEnsembleClassifier::MergePartialFromCodedStream
          (TreeEnsembleClassifier *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint32 uVar8;
  TreeEnsembleParameters *this_00;
  Int64Vector *this_01;
  StringVector *this_02;
  pair<int,_int> pVar9;
  char cVar10;
  ulong uVar11;
  
LAB_00253611:
  do {
    pbVar3 = input->buffer_;
    uVar8 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar11 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar6 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar8 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar8 = uVar6, (~(uint)*pbVar1 & uVar6) < 0x80))
        goto LAB_0025388a;
        uVar11 = (ulong)((uVar6 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar11 = uVar11 | 0x100000000;
    }
    else {
LAB_0025388a:
      uVar8 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar8);
      uVar11 = 0;
      if (uVar8 - 1 < 0x3fff) {
        uVar11 = 0x100000000;
      }
      uVar11 = uVar8 | uVar11;
    }
    uVar8 = (uint32)uVar11;
    if ((uVar11 & 0x100000000) == 0) goto LAB_0025366e;
    uVar6 = (uint)(uVar11 >> 3) & 0x1fffffff;
    cVar10 = (char)uVar11;
    if (uVar6 < 100) {
      if (uVar6 == 1) {
        if (cVar10 == '\n') {
          this_00 = this->treeensemble_;
          if (this_00 == (TreeEnsembleParameters *)0x0) {
            this_00 = (TreeEnsembleParameters *)operator_new(0x50);
            TreeEnsembleParameters::TreeEnsembleParameters(this_00);
            this->treeensemble_ = this_00;
          }
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
            input->buffer_ = puVar4 + 1;
          }
          else {
            iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            if (iVar7 < 0) {
              return false;
            }
          }
          pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                            (input,iVar7);
          if ((long)pVar9 < 0) {
            return false;
          }
          bVar5 = TreeEnsembleParameters::MergePartialFromCodedStream(this_00,input);
          goto LAB_00253876;
        }
      }
      else if ((uVar6 == 2) && (cVar10 == '\x10')) {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar2 = *pbVar3;
          uVar11 = (ulong)bVar2;
          uVar8 = (uint32)bVar2;
          if ((char)bVar2 < '\0') goto LAB_002538b0;
          input->buffer_ = pbVar3 + 1;
        }
        else {
          uVar8 = 0;
LAB_002538b0:
          uVar11 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar8);
          if ((long)uVar11 < 0) {
            return false;
          }
        }
        this->postevaluationtransform_ = (int)uVar11;
        goto LAB_00253611;
      }
LAB_0025366e:
      if (uVar8 == 0) {
        return true;
      }
      if ((uVar8 & 7) == 4) {
        return true;
      }
      bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar8);
    }
    else {
      if (uVar6 == 100) {
        if (cVar10 == '\"') {
          if (this->_oneof_case_[0] == 100) {
            this_02 = (this->ClassLabels_).stringclasslabels_;
          }
          else {
            clear_ClassLabels(this);
            this->_oneof_case_[0] = 100;
            this_02 = (StringVector *)operator_new(0x30);
            StringVector::StringVector(this_02);
            (this->ClassLabels_).stringclasslabels_ = this_02;
          }
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
            input->buffer_ = puVar4 + 1;
          }
          else {
            iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            if (iVar7 < 0) {
              return false;
            }
          }
          pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                            (input,iVar7);
          if ((long)pVar9 < 0) {
            return false;
          }
          bVar5 = StringVector::MergePartialFromCodedStream(this_02,input);
          goto LAB_00253876;
        }
        goto LAB_0025366e;
      }
      if ((uVar6 != 0x65) || (cVar10 != '*')) goto LAB_0025366e;
      if (this->_oneof_case_[0] == 0x65) {
        this_01 = (this->ClassLabels_).int64classlabels_;
      }
      else {
        clear_ClassLabels(this);
        this->_oneof_case_[0] = 0x65;
        this_01 = (Int64Vector *)operator_new(0x28);
        Int64Vector::Int64Vector(this_01);
        (this->ClassLabels_).int64classlabels_ = this_01;
      }
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (iVar7 = (int)(char)*puVar4, -1 < iVar7)) {
        input->buffer_ = puVar4 + 1;
      }
      else {
        iVar7 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar7 < 0) {
          return false;
        }
      }
      pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                        (input,iVar7);
      if ((long)pVar9 < 0) {
        return false;
      }
      bVar5 = Int64Vector::MergePartialFromCodedStream(this_01,input);
LAB_00253876:
      if (bVar5 == false) {
        return false;
      }
      bVar5 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                        (input,pVar9.first);
    }
    if (bVar5 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool TreeEnsembleClassifier::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.TreeEnsembleClassifier)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.TreeEnsembleParameters treeEnsemble = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_treeensemble()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.TreeEnsemblePostEvaluationTransform postEvaluationTransform = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_postevaluationtransform(static_cast< ::CoreML::Specification::TreeEnsemblePostEvaluationTransform >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.StringVector stringClassLabels = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_stringclasslabels()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
      case 101: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(810u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_int64classlabels()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.TreeEnsembleClassifier)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.TreeEnsembleClassifier)
  return false;
#undef DO_
}